

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynFunctionArgument * ParseFunctionArgument(ParseContext *ctx,bool lastExplicit,SynBase *lastType)

{
  Lexeme *begin;
  bool isExplicit;
  bool bVar1;
  int iVar2;
  SynBase *type;
  undefined4 extraout_var;
  Lexeme *pLVar3;
  Lexeme *end;
  undefined4 extraout_var_00;
  SynBase *initializer;
  undefined4 extraout_var_01;
  SynFunctionArgument *this_00;
  char *msg;
  InplaceStr name;
  SynIdentifier *this;
  undefined4 extraout_var_02;
  
  begin = ctx->currentLexeme;
  isExplicit = ParseContext::Consume(ctx,"explicit");
  type = ParseType(ctx,(bool *)0x0,false);
  if (type == (SynBase *)0x0) {
    if (isExplicit && type == (SynBase *)0x0) {
      pLVar3 = ctx->currentLexeme;
      msg = "ERROR: type name not found after \'explicit\' specifier";
LAB_00116d6f:
      anon_unknown.dwarf_147a9::Stop(ctx,pLVar3,msg);
    }
    this_00 = (SynFunctionArgument *)0x0;
  }
  else {
    if ((lastType != (SynBase *)0x0) && (pLVar3 = ctx->currentLexeme, pLVar3->type != lex_string)) {
      if (isExplicit) {
        msg = "ERROR: variable name not found after type in function variable list";
        goto LAB_00116d6f;
      }
      ctx->currentLexeme = begin;
      type = lastType;
      isExplicit = lastExplicit;
    }
    bVar1 = anon_unknown.dwarf_147a9::CheckAt
                      (ctx,lex_string,
                       "ERROR: variable name not found after type in function variable list");
    if (bVar1) {
      name = ParseContext::Consume(ctx);
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var,iVar2);
      pLVar3 = ParseContext::Previous(ctx);
      end = ParseContext::Previous(ctx);
      SynIdentifier::SynIdentifier(this,pLVar3,end,name);
    }
    else {
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynIdentifier *)CONCAT44(extraout_var_00,iVar2);
      SynIdentifier::SynIdentifier(this,(InplaceStr)ZEXT816(0));
    }
    if (ctx->currentLexeme->type == lex_set) {
      ctx->currentLexeme = ctx->currentLexeme + 1;
      initializer = ParseTernaryExpr(ctx);
      if (initializer == (SynBase *)0x0) {
        anon_unknown.dwarf_147a9::Report
                  (ctx,ctx->currentLexeme,"ERROR: default argument value not found after \'=\'");
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        initializer = (SynBase *)CONCAT44(extraout_var_01,iVar2);
        SynError::SynError((SynError *)initializer,ctx->currentLexeme,ctx->currentLexeme);
      }
    }
    else {
      initializer = (SynBase *)0x0;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this_00 = (SynFunctionArgument *)CONCAT44(extraout_var_02,iVar2);
    pLVar3 = ctx->currentLexeme;
    if (begin != pLVar3) {
      pLVar3 = ParseContext::Previous(ctx);
    }
    SynFunctionArgument::SynFunctionArgument(this_00,begin,pLVar3,isExplicit,type,this,initializer);
  }
  return this_00;
}

Assistant:

SynFunctionArgument* ParseFunctionArgument(ParseContext &ctx, bool lastExplicit, SynBase *lastType)
{
	Lexeme *start = ctx.currentLexeme;

	bool isExplicit = ctx.Consume("explicit");

	if(SynBase *type = ParseType(ctx))
	{
		if(!ctx.At(lex_string) && lastType)
		{
			if(isExplicit)
				Stop(ctx, ctx.Current(), "ERROR: variable name not found after type in function variable list");

			// Backtrack
			ctx.currentLexeme = start;

			isExplicit = lastExplicit;
			type = lastType;
		}

		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: variable name not found after type in function variable list"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		SynBase *initializer = NULL;

		if(ctx.Consume(lex_set))
		{
			initializer = ParseTernaryExpr(ctx);

			if(!initializer)
			{
				Report(ctx, ctx.Current(), "ERROR: default argument value not found after '='");

				initializer = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		return new (ctx.get<SynFunctionArgument>()) SynFunctionArgument(start, start == ctx.currentLexeme ? ctx.Current() : ctx.Previous(), isExplicit, type, nameIdentifier, initializer);
	}

	if(isExplicit)
		Stop(ctx, ctx.Current(), "ERROR: type name not found after 'explicit' specifier");

	return NULL;
}